

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
          (SmallVector<char,256u> *this,char *S,char *E)

{
  char *E_local;
  char *S_local;
  SmallVector<char,_256U> *this_local;
  
  SmallVectorImpl<char>::SmallVectorImpl((SmallVectorImpl<char> *)this,0x100);
  SmallVectorImpl<char>::append<char_const*,void>((SmallVectorImpl<char> *)this,S,E);
  return;
}

Assistant:

SmallVector(ItTy S, ItTy E) : SmallVectorImpl<T>(N) {
    this->append(S, E);
  }